

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

char * lua_pushlstring(lua_State *L,char *s,size_t len)

{
  StkId pSVar1;
  TString *local_40;
  TString *x_;
  TValue *io;
  TString *ts;
  size_t len_local;
  char *s_local;
  lua_State *L_local;
  
  if (len == 0) {
    local_40 = luaS_new(L,"");
  }
  else {
    local_40 = luaS_newlstr(L,s,len);
  }
  pSVar1 = (L->top).p;
  *(TString **)pSVar1 = local_40;
  (pSVar1->val).tt_ = local_40->tt | 0x40;
  (L->top).p = (StkId)((L->top).offset + 0x10);
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
  }
  return local_40->contents;
}

Assistant:

LUA_API const char *lua_pushlstring (lua_State *L, const char *s, size_t len) {
  TString *ts;
  lua_lock(L);
  ts = (len == 0) ? luaS_new(L, "") : luaS_newlstr(L, s, len);
  setsvalue2s(L, L->top.p, ts);
  api_incr_top(L);
  luaC_checkGC(L);
  lua_unlock(L);
  return getstr(ts);
}